

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write.c
# Opt level: O2

archive_write_filter * filter_lookup(archive *_a,int n)

{
  archive_write_filter *paVar1;
  archive_write *a;
  
  if (n == -1) {
    paVar1 = (archive_write_filter *)_a[1].current_code;
  }
  else {
    if (n < 0) {
      return (archive_write_filter *)0x0;
    }
    paVar1 = (archive_write_filter *)&_a[1].error_string;
    while ((paVar1 = paVar1->next_filter, 0 < n && (paVar1 != (archive_write_filter *)0x0))) {
      n = n + -1;
    }
  }
  return paVar1;
}

Assistant:

static struct archive_write_filter *
filter_lookup(struct archive *_a, int n)
{
	struct archive_write *a = (struct archive_write *)_a;
	struct archive_write_filter *f = a->filter_first;
	if (n == -1)
		return a->filter_last;
	if (n < 0)
		return NULL;
	while (n > 0 && f != NULL) {
		f = f->next_filter;
		--n;
	}
	return f;
}